

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O2

adios2_error
adios2_variable_shape_with_memory_space
          (size_t *shape,adios2_variable *variable,adios2_memory_space mem)

{
  MemorySpace MVar1;
  Dims shapeCpp;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string
            ((string *)&local_38,"for const adios2_variable, in call to adios2_variable_shape",
             (allocator *)&shapeCpp);
  adios2::helper::CheckForNullptr<adios2_variable_const>(variable,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string
            ((string *)&local_58,"for size_t* shape, in call to adios2_variable_shape",
             (allocator *)&shapeCpp);
  adios2::helper::CheckForNullptr<unsigned_long>(shape,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  switch(*(undefined4 *)(variable + 0x28)) {
  case 1:
    MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<signed_char>::typeinfo,0);
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_70);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_70,MVar1,~RowMajor);
    }
    break;
  case 2:
    MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<short>::typeinfo,0);
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_70);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_70,MVar1,~RowMajor);
    }
    break;
  case 3:
    MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<int>::typeinfo,0);
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_70);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_70,MVar1,~RowMajor);
    }
    break;
  case 4:
    MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<long>::typeinfo,0);
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_70);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_70,MVar1,~RowMajor);
    }
    break;
  case 5:
    MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<unsigned_char>::typeinfo,0);
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_70);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_70,MVar1,~RowMajor);
    }
    break;
  case 6:
    MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<unsigned_short>::typeinfo,0);
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_70);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_70,MVar1,~RowMajor);
    }
    break;
  case 7:
    MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<unsigned_int>::typeinfo,0);
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_70);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_70,MVar1,~RowMajor);
    }
    break;
  case 8:
    MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<unsigned_long>::typeinfo,0);
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_70);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_70,MVar1,~RowMajor);
    }
    break;
  case 9:
    MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<float>::typeinfo,0);
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_70);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_70,MVar1,~RowMajor);
    }
    break;
  case 10:
    MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<double>::typeinfo,0);
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_70);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_70,MVar1,~RowMajor);
    }
    break;
  case 0xb:
    MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<long_double>::typeinfo,0);
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_70);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_70,MVar1,~RowMajor);
    }
    break;
  case 0xc:
    MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<std::complex<float>>::typeinfo,0);
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_70);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_70,MVar1,~RowMajor);
    }
    break;
  case 0xd:
    MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<std::complex<double>>::typeinfo,0);
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_70);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_70,MVar1,~RowMajor);
    }
    break;
  case 0xe:
    MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<std::__cxx11::string>::typeinfo,0);
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_70);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_70,MVar1,~RowMajor);
    }
    break;
  case 0xf:
    MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<char>::typeinfo,0);
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_70);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_70,MVar1,~RowMajor);
    }
    break;
  default:
    goto switchD_00124e7e_default;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(&shapeCpp,&local_70);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_70);
  if ((long)shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    memmove(shape,shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start,
            (long)shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shapeCpp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
switchD_00124e7e_default:
  return adios2_error_none;
}

Assistant:

adios2_error adios2_variable_shape_with_memory_space(size_t *shape, const adios2_variable *variable,
                                                     adios2_memory_space mem)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for const adios2_variable, in call to "
                                                  "adios2_variable_shape");
        adios2::helper::CheckForNullptr(shape, "for size_t* shape, in call to "
                                               "adios2_variable_shape");

        const adios2::core::VariableBase *variableBase =
            reinterpret_cast<const adios2::core::VariableBase *>(variable);

        const adios2::DataType typeCpp = variableBase->m_Type;
        if (typeCpp == adios2::DataType::Struct)
        {
            // not supported
        }
#define declare_template_instantiation(T)                                                          \
    else if (typeCpp == adios2::helper::GetDataType<T>())                                          \
    {                                                                                              \
        const adios2::core::Variable<T> *variable =                                                \
            dynamic_cast<const adios2::core::Variable<T> *>(variableBase);                         \
        adios2::Dims shapeCpp;                                                                     \
        if (mem == adios2_memory_space_host)                                                       \
            shapeCpp = variable->Shape(adios2::EngineCurrentStep);                                 \
        else                                                                                       \
            shapeCpp = variable->Shape(adios2::EngineCurrentStep, adios2_ToMemorySpace(mem));      \
        std::copy(shapeCpp.begin(), shapeCpp.end(), shape);                                        \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation

        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_variable_shape"));
    }
}